

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::SlotI1
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  uint32 slotId_00;
  ProfileId local_3a;
  uint32 local_38;
  ProfileId profileId_local;
  OpCode op_local;
  
  local_3a = profileId;
  local_38 = slotId;
  profileId_local = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3d);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x694,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cdf91;
    *puVar3 = 0;
  }
  value_00 = ConsumeReg(this,value);
  if (((op - 0x134 < 9) && ((0x141U >> (op - 0x134 & 0x1f) & 1) != 0)) || (op == LdLocalSlot)) {
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if (bVar2) {
      bVar2 = profileId == 0xffff;
    }
    else {
      bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
      bVar2 = !bVar2 || profileId == 0xffff;
    }
    slotId_00 = local_38;
    if (!bVar2) {
      OpCodeUtil::ConvertNonCallOpToProfiled(&profileId_local);
      op = profileId_local;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6a6,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) goto LAB_007cdf91;
    *puVar3 = 0;
    slotId_00 = local_38;
  }
  bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,value_00,slotId_00)
  ;
  if (!bVar2) {
    bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,profileId_local,value_00,slotId_00);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,profileId_local,value_00,slotId_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x6ab,"(success)","success");
        if (!bVar2) {
LAB_007cdf91:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  bVar2 = OpCodeAttr::IsProfiledOp(profileId_local);
  if (bVar2) {
    Data::Write(&this->m_byteCodeData,&local_3a,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::SlotI1(OpCode op, RegSlot value, uint32 slotId, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;
            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI1, op, value, slotId);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }